

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O2

int Abc_NamStrFindOrAddLim(Abc_Nam_t *p,char *pStr,char *pLim,int *pfFound)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  size_t __n;
  
  if (pStr < pLim) {
    piVar2 = Abc_NamStrHashFind(p,pStr,pLim);
    iVar4 = *piVar2;
    if (iVar4 == 0) {
      if (pfFound != (int *)0x0) {
        *pfFound = 0;
      }
      __n = (long)pLim - (long)pStr;
      iVar4 = (int)__n + p->iHandle + 1;
      while (p->nStore < iVar4) {
        iVar1 = (p->nStore * 3) / 2;
        p->nStore = iVar1;
        if (p->pStore == (char *)0x0) {
          pcVar3 = (char *)malloc((long)iVar1);
        }
        else {
          pcVar3 = (char *)realloc(p->pStore,(long)iVar1);
        }
        p->pStore = pcVar3;
      }
      *piVar2 = (p->vInt2Handle).nSize;
      iVar1 = p->iHandle;
      pcVar3 = p->pStore;
      strncpy(pcVar3 + iVar1,pStr,__n);
      (pcVar3 + iVar1)[__n] = '\0';
      Vec_IntPush(&p->vInt2Handle,p->iHandle);
      Vec_IntPush(&p->vInt2Next,0);
      p->iHandle = iVar4;
      iVar4 = (p->vInt2Handle).nSize;
      if (p->nBins * 2 < iVar4) {
        Abc_NamStrHashResize(p);
        iVar4 = (p->vInt2Handle).nSize;
      }
      iVar4 = iVar4 + -1;
    }
    else if (pfFound != (int *)0x0) {
      *pfFound = 1;
      iVar4 = *piVar2;
    }
    return iVar4;
  }
  __assert_fail("pStr < pLim",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                ,0x1b6,"int Abc_NamStrFindOrAddLim(Abc_Nam_t *, char *, char *, int *)");
}

Assistant:

int Abc_NamStrFindOrAddLim( Abc_Nam_t * p, char * pStr, char * pLim, int * pfFound )
{
    int iHandleNew;
    int *piPlace;
    char * pStore;
    assert( pStr < pLim );
    piPlace = Abc_NamStrHashFind( p, pStr, pLim );
    if ( *piPlace )
    {
        if ( pfFound )
            *pfFound = 1;
        return *piPlace;
    }
    if ( pfFound )
        *pfFound = 0;
    iHandleNew = p->iHandle + (pLim - pStr) + 1;
    while ( p->nStore < iHandleNew )
    {
        p->nStore *= 3;
        p->nStore /= 2;
        p->pStore  = ABC_REALLOC( char, p->pStore, p->nStore );
    }
    assert( p->nStore >= iHandleNew );
    // create new handle
    *piPlace = Vec_IntSize( &p->vInt2Handle );
    pStore = Abc_NamHandleToStr( p, p->iHandle );
    strncpy( pStore, pStr, pLim - pStr );
    pStore[pLim - pStr] = 0;
    Vec_IntPush( &p->vInt2Handle, p->iHandle );
    Vec_IntPush( &p->vInt2Next, 0 );
    p->iHandle = iHandleNew;
    // extend the hash table
    if ( Vec_IntSize(&p->vInt2Handle) > 2 * p->nBins )
        Abc_NamStrHashResize( p );
    return Vec_IntSize(&p->vInt2Handle) - 1;
}